

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

cni_holder_base *
cs_impl::cni::construct_helper<cs_impl::any(cs_impl::fiber::Channel<cs_impl::any>::*)()>::
_construct<cs_impl::any(cs_impl::fiber::Channel<cs_impl::any>::*&)(),cs_impl::any,cs_impl::fiber::Channel<cs_impl::any>&>
          (offset_in_Channel<cs_impl::any>_to_subr *val,
          _func_any_Channel<cs_impl::any>_ptr *target_function)

{
  cni_holder_base *pcVar1;
  _func_any_Channel<cs_impl::any>_ptr *in_stack_ffffffffffffffd8;
  _func_any_Channel<cs_impl::any>_ptr *in_stack_ffffffffffffffe0;
  
  check_conversion<cs_impl::any,cs_impl::any,cs_impl::fiber::Channel<cs_impl::any>&,cs_impl::fiber::Channel<cs_impl::any>&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pcVar1 = (cni_holder_base *)operator_new(0x28);
  cni_holder<cs_impl::any_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_cs_impl::any_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
  ::cni_holder((cni_holder<cs_impl::any_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_cs_impl::any_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
                *)val,(offset_in_Channel<cs_impl::any>_to_subr *)target_function);
  return pcVar1;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}